

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ysf.cpp
# Opt level: O1

void __thiscall DSDcc::DSDYSF::processVD2Voice(DSDYSF *this,int mbeIndex,uchar dibit)

{
  uchar *puVar1;
  uint uVar2;
  DSDDecoder *pDVar3;
  ulong uVar4;
  ulong uVar5;
  uchar uVar6;
  
  if (mbeIndex == 0) {
    this->w = &rW;
    this->x = &rX;
    this->y = &rY;
    this->z = &rZ;
    pDVar3 = this->m_dsdDecoder;
    pDVar3->m_mbeDVFrame1[8] = '\0';
    pDVar3->m_mbeDVFrame1[0] = '\0';
    pDVar3->m_mbeDVFrame1[1] = '\0';
    pDVar3->m_mbeDVFrame1[2] = '\0';
    pDVar3->m_mbeDVFrame1[3] = '\0';
    pDVar3->m_mbeDVFrame1[4] = '\0';
    pDVar3->m_mbeDVFrame1[5] = '\0';
    pDVar3->m_mbeDVFrame1[6] = '\0';
    pDVar3->m_mbeDVFrame1[7] = '\0';
    memset(this->m_vd2BitsRaw,0,0xb0);
  }
  uVar2 = *(uint *)(m_vd2Interleave + (long)(mbeIndex * 2 + 1) * 4);
  this->m_vd2BitsRaw[*(uint *)(m_vd2Interleave + (long)(mbeIndex * 2) * 4)] =
       dibit >> 1 & 1 ^
       (this->m_pn).m_bitTable[(ulong)*(uint *)(m_vd2Interleave + (long)(mbeIndex * 2) * 4) & 0x1ff]
  ;
  this->m_vd2BitsRaw[uVar2] = dibit & 1 ^ (this->m_pn).m_bitTable[(ulong)uVar2 & 0x1ff];
  if (mbeIndex == 0x33) {
    if (this->m_vd2BitsRaw[0x67] != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"DSDYSF::processVD2Voice: error bit 103",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    uVar5 = 0;
    do {
      if (uVar5 < 0x51) {
        if ((int)(uVar5 / 3) * 3 + 2 == (int)uVar5) {
          uVar4 = (uVar5 & 0xffffffff) / 3;
          uVar6 = 1 < (uint)this->m_vd2BitsRaw[uVar5] +
                      (uint)this->m_vd2BitsRaw[uVar5 - 1] + (uint)this->m_vd2BitsRaw[uVar5 - 2];
          this->m_vd2MBEBits[uVar4] = uVar6;
          goto LAB_0011a36d;
        }
      }
      else {
        uVar6 = this->m_vd2BitsRaw[uVar5];
        uVar4 = uVar5 - 0x36;
        this->m_vd2BitsRaw[uVar5 + 0x32] = uVar6;
LAB_0011a36d:
        puVar1 = this->m_dsdDecoder->m_mbeDVFrame1 + ((uint)(&m_vd2DVSIInterleave)[uVar4] >> 3);
        *puVar1 = *puVar1 + (uVar6 << (~(byte)(&m_vd2DVSIInterleave)[uVar4] & 7));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x67);
    DSDMBEDecoder::processData
              (&this->m_dsdDecoder->m_mbeDecoder1,(char *)0x0,(char *)this->m_vd2MBEBits);
    this->m_dsdDecoder->m_mbeDVReady1 = true;
  }
  return;
}

Assistant:

void DSDYSF::processVD2Voice(int mbeIndex, unsigned char dibit)
{
    if (mbeIndex == 0) // init
    {
        w = rW;
        x = rX;
        y = rY;
        z = rZ;

        memset((void *) m_dsdDecoder->m_mbeDVFrame1, 0, 9); // initialize DVSI frame
        memset(m_vd2BitsRaw, 0, 104);
        memset(m_vd2MBEBits, 0, 72);
    }

    // de-interleave and de-whiten in one shot
    unsigned int msbI = m_vd2Interleave[2*mbeIndex];
    unsigned int lsbI = m_vd2Interleave[2*mbeIndex+1];
    m_vd2BitsRaw[msbI] = ((dibit>>1) & 1) ^ m_pn.getBit(msbI);
    m_vd2BitsRaw[lsbI] = (dibit & 1) ^ m_pn.getBit(lsbI);

    if (mbeIndex == 52 - 1) // final
    {
        int nbOnes;
        unsigned int mbeIndex;
        unsigned int bit;

        if (m_vd2BitsRaw[103] != 0) {
            std::cerr << "DSDYSF::processVD2Voice: error bit 103" << std::endl;
        }

        for (int i = 0; i < 103; i++)
        {
            if (i < 81)
            {
                if (i%3 == 2)
                {
                    nbOnes = m_vd2BitsRaw[i-2] + m_vd2BitsRaw[i-1] + m_vd2BitsRaw[i];
                    bit = nbOnes > 1 ? 1 : 0;
                    m_vd2MBEBits[i/3] = bit;
                    mbeIndex = m_vd2DVSIInterleave[i/3];
                    m_dsdDecoder->m_mbeDVFrame1[mbeIndex/8] += bit<<(7-(mbeIndex%8));
                }
            }
            else if (i < 103)
            {
                m_vd2MBEBits[i-81+27] = m_vd2BitsRaw[i];
                mbeIndex = m_vd2DVSIInterleave[i-81+27];
                m_dsdDecoder->m_mbeDVFrame1[mbeIndex/8] += (m_vd2BitsRaw[i])<<(7-(mbeIndex%8));
            }
        }

        m_dsdDecoder->m_mbeDecoder1.processData(0, (char *) m_vd2MBEBits);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available
    }
}